

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestMixedComment(UnitTest *this)

{
  bool result;
  int iVar1;
  element_type *peVar2;
  mapped_type *this_00;
  mapped_type *a;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  key_type local_288;
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  string local_238 [32];
  istringstream local_218 [8];
  istringstream ss;
  shared_ptr<inipp::Format<char>_> local_88;
  undefined1 local_78 [8];
  Ini<char> ini;
  shared_ptr<MixedFormat> fmt;
  UnitTest *this_local;
  
  std::make_shared<MixedFormat>();
  std::shared_ptr<inipp::Format<char>>::shared_ptr<MixedFormat,void>
            ((shared_ptr<inipp::Format<char>> *)&local_88,
             (shared_ptr<MixedFormat> *)
             &ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  inipp::Ini<char>::Ini((Ini<char> *)local_78,&local_88);
  std::shared_ptr<inipp::Format<char>_>::~shared_ptr(&local_88);
  peVar2 = std::__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&ini.errors.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size);
  iVar1 = (*peVar2->_vptr_Format[3])(peVar2,0x23);
  Assert::IsTrue((bool)((byte)iVar1 & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"# hello world\n; hello world\n\' hello world\n[default]\na=2",&local_239);
  std::__cxx11::istringstream::istringstream(local_218,local_238,8);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  inipp::Ini<char>::parse
            ((Ini<char> *)local_78,(basic_istream<char,_std::char_traits<char>_> *)local_218);
  WriteMessage<char>((Ini<char> *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"default",&local_261);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)local_78,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"a",&local_289);
  a = std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(this_00,&local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"2",&local_2b1);
  Assert::AreEqual<std::__cxx11::string>(a,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  result = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ini.sections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Assert::IsTrue(result);
  std::__cxx11::istringstream::~istringstream(local_218);
  inipp::Ini<char>::~Ini((Ini<char> *)local_78);
  std::shared_ptr<MixedFormat>::~shared_ptr
            ((shared_ptr<MixedFormat> *)
             &ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST_METHOD(TestMixedComment)
		{
			auto fmt = std::make_shared<MixedFormat>();
			Ini<char> ini(fmt);
			Assert::IsTrue(ini.format->is_comment('#'));
			std::istringstream ss("# hello world\n; hello world\n' hello world\n[default]\na=2");
			ini.parse(ss);
			WriteMessage(ini);
			Assert::AreEqual(ini.sections.at("default").at("a"), std::string("2"));
			Assert::IsTrue(ini.errors.empty());
		}